

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occlusion_tester.h
# Opt level: O0

void __thiscall OcclusionTester::set_points(OcclusionTester *this,Vec3f_8 *a,Vec3f_8 *b)

{
  Vec3f_8 o;
  undefined1 auVar1 [56];
  Vec3f_8 d;
  undefined1 auVar2 [64];
  void *in_RSI;
  void *in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Vec3f_8 *in_stack_fffffffffffffc88;
  Vec3f_8 *in_stack_fffffffffffffc90;
  undefined1 auVar6 [16];
  Vec3f_8 *in_stack_fffffffffffffcd0;
  undefined1 auVar7 [32];
  undefined8 in_stack_fffffffffffffd40;
  undefined1 local_240 [32];
  undefined1 auStack_220 [32];
  undefined1 auStack_200 [32];
  undefined1 local_1e0 [32];
  undefined1 auStack_1c0 [32];
  undefined1 auStack_1a0 [32];
  undefined1 local_180 [376];
  
  memcpy(local_1e0,in_RSI,0x60);
  operator-(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  Vec3f_8::normalized(in_stack_fffffffffffffcd0);
  auVar4._32_32_ = auStack_220;
  auVar4._0_32_ = local_240;
  auVar3 = vmovdqu64_avx512f(auVar4);
  auVar5._32_32_ = auStack_200;
  auVar5._0_32_ = auStack_220;
  auVar4 = vmovdqu64_avx512f(auVar5);
  auVar4 = vmovdqu64_avx512f(auVar4);
  auVar7 = auVar4._32_32_;
  auVar4 = vmovdqu64_avx512f(auVar3);
  auVar3._32_32_ = auStack_1c0;
  auVar3._0_32_ = local_1e0;
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar2._32_32_ = auStack_1a0;
  auVar2._0_32_ = auStack_1c0;
  auVar5 = vmovdqu64_avx512f(auVar2);
  auVar5 = vmovdqu64_avx512f(auVar5);
  auVar6 = auVar5._32_16_;
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar1 = auVar3._8_56_;
  o.y[6] = (float)auVar6._0_4_;
  o.y[7] = (float)auVar6._4_4_;
  o.z[0] = (float)auVar6._8_4_;
  o.z[1] = (float)auVar6._12_4_;
  o.x[0] = (float)auVar1._0_4_;
  o.x[1] = (float)auVar1._4_4_;
  o.x[2] = (float)auVar1._8_4_;
  o.x[3] = (float)auVar1._12_4_;
  o.x[4] = (float)auVar1._16_4_;
  o.x[5] = (float)auVar1._20_4_;
  o.x[6] = (float)auVar1._24_4_;
  o.x[7] = (float)auVar1._28_4_;
  o.y[0] = (float)auVar1._32_4_;
  o.y[1] = (float)auVar1._36_4_;
  o.y[2] = (float)auVar1._40_4_;
  o.y[3] = (float)auVar1._44_4_;
  o.y[4] = (float)auVar1._48_4_;
  o.y[5] = (float)auVar1._52_4_;
  o.z[2] = (float)(int)auVar5._48_8_;
  o.z[3] = (float)(int)((ulong)auVar5._48_8_ >> 0x20);
  o.z[4] = (float)(int)auVar5._56_8_;
  o.z[5] = (float)(int)((ulong)auVar5._56_8_ >> 0x20);
  o.z[6] = (float)(int)auVar4._0_8_;
  o.z[7] = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  auVar1 = auVar4._8_56_;
  d.y[6] = (float)auVar7._0_4_;
  d.y[7] = (float)auVar7._4_4_;
  d.z[0] = (float)auVar7._8_4_;
  d.z[1] = (float)auVar7._12_4_;
  d.z[2] = (float)auVar7._16_4_;
  d.z[3] = (float)auVar7._20_4_;
  d.z[4] = (float)auVar7._24_4_;
  d.z[5] = (float)auVar7._28_4_;
  d.x[0] = (float)auVar1._0_4_;
  d.x[1] = (float)auVar1._4_4_;
  d.x[2] = (float)auVar1._8_4_;
  d.x[3] = (float)auVar1._12_4_;
  d.x[4] = (float)auVar1._16_4_;
  d.x[5] = (float)auVar1._20_4_;
  d.x[6] = (float)auVar1._24_4_;
  d.x[7] = (float)auVar1._28_4_;
  d.y[0] = (float)auVar1._32_4_;
  d.y[1] = (float)auVar1._36_4_;
  d.y[2] = (float)auVar1._40_4_;
  d.y[3] = (float)auVar1._44_4_;
  d.y[4] = (float)auVar1._48_4_;
  d.y[5] = (float)auVar1._52_4_;
  d.z[6] = (float)(int)in_stack_fffffffffffffd40;
  d.z[7] = (float)(int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  Ray8::Ray8(auVar3._0_8_,o,d,0.0,1.666151e-39);
  memcpy(in_RDI,local_180,0x120);
  return;
}

Assistant:

inline void set_points(const Vec3f_8 &a, const Vec3f_8 &b){
		rays = Ray8{a, (b - a).normalized(), 0.001f, 0.999f};
	}